

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menu.c
# Opt level: O2

wchar_t curses_display_menu_core
                  (nh_menuitem_conflict *items,wchar_t icount,char *title,wchar_t how,
                  wchar_t *results,wchar_t x1,wchar_t y1,wchar_t x2,wchar_t y2,
                  _func_nh_bool_win_menu_ptr_wchar_t *changefn,nh_bool start_at_bottom)

{
  int iVar1;
  bool bVar2;
  nh_bool nVar3;
  undefined4 uVar4;
  int iVar5;
  wchar_t wVar6;
  gamewin *gw;
  WINDOW *pWVar7;
  _func_void_gamewin_ptr *p_Var8;
  char *pcVar9;
  char cVar10;
  uint uVar11;
  size_t __nmemb;
  size_t sVar12;
  uint uVar13;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  int iVar17;
  uint uVar18;
  ulong uVar19;
  long lVar20;
  bool bVar21;
  wchar_t local_158;
  char sbuf [256];
  
  sVar12 = 0;
  uVar4 = curs_set(0);
  gw = alloc_gamewin(L'\x98');
  gw->draw = draw_menu;
  gw->resize = resize_menu;
  gw[1].resize = (_func_void_gamewin_ptr *)items;
  *(wchar_t *)&gw[1].prev = icount;
  gw[1].next = (gamewin *)title;
  *(wchar_t *)((long)&gw[1].prev + 4) = how;
  __nmemb = (size_t)icount;
  pWVar7 = (WINDOW *)calloc(__nmemb,1);
  gw[1].win = pWVar7;
  *(wchar_t *)((long)&gw[4].resize + 4) = x1;
  *(wchar_t *)&gw[4].win = y1;
  *(wchar_t *)((long)&gw[4].win + 4) = x2;
  *(wchar_t *)&gw[4].next = y2;
  wVar6 = _LINES;
  uVar16 = (ulong)(uint)x1;
  if (x1 < L'\x01') {
    uVar16 = sVar12;
  }
  local_158 = x2;
  if (x2 < L'\0') {
    local_158 = _COLS;
  }
  if ((long)__nmemb < 1) {
    __nmemb = sVar12;
  }
  cVar10 = 'a';
  for (; __nmemb * 0x10c - sVar12 != 0; sVar12 = sVar12 + 0x10c) {
    if ((((&items->accel)[sVar12] == '\0') && (*(int *)(items->caption + (sVar12 - 4)) == 1)) &&
       (*(int *)(items->caption + (sVar12 - 8)) != 0)) {
      (&items->accel)[sVar12] = cVar10;
      if (cVar10 == 'z') {
        cVar10 = 'A';
      }
      else if (cVar10 == 'Z') {
        cVar10 = 'a';
      }
      else {
        cVar10 = cVar10 + '\x01';
      }
    }
  }
  if (y1 < L'\x01') {
    y1 = L'\0';
  }
  if (L'\xffffffff' < y2) {
    wVar6 = y2;
  }
  layout_menu(gw);
  if (start_at_bottom != '\0') {
    iVar5 = *(int *)&gw[1].prev - *(int *)((long)&gw[2].resize + 4);
    if (iVar5 < 1) {
      iVar5 = 0;
    }
    *(int *)&gw[2].draw = iVar5;
  }
  iVar5 = *(int *)((long)&gw[2].draw + 4);
  pWVar7 = (WINDOW *)
           newwin(iVar5,*(int *)&gw[2].win,y1 + ((wVar6 - y1) - iVar5) / 2,
                  (int)uVar16 + ((local_158 - (int)uVar16) - *(int *)&gw[2].win) / 2);
  gw->win = pWVar7;
  keypad(pWVar7,1);
  nh_box_wborder((WINDOW_conflict *)gw->win,0x600);
  p_Var8 = (_func_void_gamewin_ptr *)
           derwin(gw->win,*(undefined4 *)((long)&gw[2].resize + 4),
                  *(undefined4 *)((long)&gw[2].win + 4),*(int *)&gw[2].resize + -1,2);
  gw[1].draw = p_Var8;
  leaveok(gw->win,1);
  leaveok(gw[1].draw,1);
  if (icount < L'\x01') {
    icount = L'\0';
  }
  uVar16 = (ulong)(uint)icount;
LAB_0010c776:
  bVar21 = false;
LAB_0010c778:
  bVar2 = false;
LAB_0010c77b:
  if (bVar21 || bVar2) {
    delwin(gw[1].draw);
    delwin(gw->win);
    if (bVar2) {
      wVar6 = L'\xffffffff';
    }
    else {
      wVar6 = L'\0';
      for (uVar14 = 0; uVar16 != uVar14; uVar14 = uVar14 + 1) {
        if (*(char *)((long)((gw[1].win)->_bkgrnd).chars + (uVar14 - 0x5c)) != '\0') {
          if (results != (wchar_t *)0x0) {
            results[wVar6] = items->id;
          }
          wVar6 = wVar6 + L'\x01';
        }
        items = items + 1;
      }
    }
    free(gw[1].win);
    delete_gamewin(gw);
    redraw_game_windows();
    curs_set(uVar4);
    return wVar6;
  }
  draw_menu(gw);
  wVar6 = nh_wgetch(gw->win);
  if (wVar6 == L'\r') {
LAB_0010c989:
    bVar21 = true;
    goto LAB_0010c778;
  }
  if (wVar6 == L'\x1b') {
    bVar2 = true;
    bVar21 = false;
    goto LAB_0010c77b;
  }
  if (wVar6 == L' ') {
LAB_0010c943:
    uVar13 = *(uint *)&gw[2].draw;
    iVar5 = *(int *)((long)&gw[2].resize + 4);
    uVar11 = *(int *)&gw[1].prev - iVar5;
    uVar18 = iVar5 + uVar13;
    if ((int)uVar11 <= (int)uVar18) {
      uVar18 = uVar11;
    }
    *(uint *)&gw[2].draw = uVar18;
    uVar13 = uVar18 ^ uVar13 | wVar6 ^ 0x20U;
    goto LAB_0010c963;
  }
  if (wVar6 == L'Ũ') {
LAB_0010c971:
    iVar5 = *(int *)&gw[1].prev;
LAB_0010c975:
    iVar5 = iVar5 - *(int *)((long)&gw[2].resize + 4);
    if (iVar5 < 1) {
      iVar5 = 0;
    }
    goto LAB_0010c980;
  }
  if (wVar6 == L'.') {
    bVar21 = false;
    bVar2 = false;
    if (*(int *)((long)&gw[1].prev + 4) != 2) goto LAB_0010c77b;
    lVar15 = 4;
    for (uVar14 = 0; uVar16 != uVar14; uVar14 = uVar14 + 1) {
      if (*(int *)(gw[1].resize + lVar15) == 1) {
        *(undefined1 *)((long)((gw[1].win)->_bkgrnd).chars + (uVar14 - 0x5c)) = 1;
      }
      lVar15 = lVar15 + 0x10c;
    }
  }
  else {
    if (wVar6 == L':') {
      curses_getline("Search:",sbuf);
      lVar15 = 8;
      uVar14 = 0;
      goto LAB_0010c9a5;
    }
    if (wVar6 == L'<') {
LAB_0010c96b:
      iVar5 = *(int *)&gw[2].draw;
      goto LAB_0010c975;
    }
    if (wVar6 == L'>') goto LAB_0010c943;
    if (wVar6 == L'^') {
LAB_0010ca3e:
      *(undefined4 *)&gw[2].draw = 0;
      goto LAB_0010c776;
    }
    if (wVar6 == L'|') goto LAB_0010c971;
    if (wVar6 == L'Ă') {
      bVar21 = false;
      bVar2 = false;
      if (*(int *)&gw[2].draw < *(int *)&gw[1].prev - *(int *)((long)&gw[2].resize + 4)) {
        iVar5 = *(int *)&gw[2].draw + 1;
LAB_0010ca72:
        *(int *)&gw[2].draw = iVar5;
        goto LAB_0010c776;
      }
      goto LAB_0010c77b;
    }
    if (wVar6 == L'ă') {
      if (0 < *(int *)&gw[2].draw) {
        iVar5 = *(int *)&gw[2].draw + -1;
        goto LAB_0010ca72;
      }
      goto LAB_0010c776;
    }
    if (wVar6 == L'Ć') goto LAB_0010ca3e;
    if (wVar6 == L'Œ') goto LAB_0010c943;
    if (wVar6 == L'œ') goto LAB_0010c96b;
    if (wVar6 == L'ŗ') goto LAB_0010c989;
    if (wVar6 != L'-') {
      uVar13 = *(uint *)&gw[1].prev;
      iVar5 = *(int *)((long)&gw[2].resize + 4);
      iVar1 = *(int *)&gw[2].draw;
      uVar14 = (ulong)iVar1;
      uVar18 = iVar1 + iVar5;
      if ((int)uVar13 < iVar1 + iVar5) {
        uVar18 = uVar13;
      }
      lVar15 = uVar14 * 0x10c + 0x108;
      for (uVar19 = uVar14; (long)uVar19 < (long)(int)uVar18; uVar19 = uVar19 + 1) {
        if (wVar6 == (char)gw[1].resize[lVar15]) goto LAB_0010c9fc;
        lVar15 = lVar15 + 0x10c;
      }
      lVar15 = uVar14 * 0x10c + 0x109;
      for (uVar19 = uVar14; (long)uVar19 < (long)(int)uVar18; uVar19 = uVar19 + 1) {
        if (wVar6 == (char)gw[1].resize[lVar15]) goto LAB_0010c9fc;
        lVar15 = lVar15 + 0x10c;
      }
      bVar21 = false;
      bVar2 = false;
      if (iVar5 < (int)uVar13) goto code_r0x0010c907;
      goto LAB_0010c77b;
    }
    for (uVar14 = 0; uVar16 != uVar14; uVar14 = uVar14 + 1) {
      *(undefined1 *)((long)((gw[1].win)->_bkgrnd).chars + (uVar14 - 0x5c)) = 0;
    }
  }
  goto LAB_0010c776;
LAB_0010c9a5:
  if (uVar16 == uVar14) goto LAB_0010c776;
  pcVar9 = strstr((char *)(gw[1].resize + lVar15),sbuf);
  if (pcVar9 != (char *)0x0) goto LAB_0010c9ce;
  uVar14 = uVar14 + 1;
  lVar15 = lVar15 + 0x10c;
  goto LAB_0010c9a5;
LAB_0010c9ce:
  iVar5 = *(int *)&gw[1].prev - *(int *)((long)&gw[2].resize + 4);
  if (iVar5 < 1) {
    iVar5 = 0;
  }
  if ((int)uVar14 < iVar5) {
    iVar5 = (int)uVar14;
  }
LAB_0010c980:
  bVar21 = false;
  *(int *)&gw[2].draw = iVar5;
  goto LAB_0010c778;
code_r0x0010c907:
  if ((int)uVar13 < 1) {
    uVar13 = 0;
  }
  lVar15 = 0x108;
  lVar20 = 0;
  while( true ) {
    if (-lVar20 == (ulong)uVar13) goto LAB_0010c776;
    if (wVar6 == (char)gw[1].resize[lVar15]) break;
    lVar20 = lVar20 + -1;
    lVar15 = lVar15 + 0x10c;
  }
  iVar17 = (int)lVar20;
  uVar18 = -iVar17;
  uVar19 = (ulong)uVar18;
  uVar13 = 1 - (iVar5 + iVar17);
  if (SBORROW4(iVar1,uVar18) == iVar1 + iVar17 < 0) {
    uVar13 = uVar18;
  }
  *(uint *)&gw[2].draw = uVar13;
LAB_0010c9fc:
  wVar6 = (wchar_t)uVar19;
  if ((wVar6 == L'\xffffffff') ||
     ((changefn != (_func_nh_bool_win_menu_ptr_wchar_t *)0x0 &&
      (nVar3 = (*changefn)((win_menu *)(gw + 1),wVar6), nVar3 == '\0')))) goto LAB_0010c776;
  *(bool *)((long)((gw[1].win)->_bkgrnd).chars + (long)wVar6 + -0x5c) =
       *(char *)((long)((gw[1].win)->_bkgrnd).chars + (long)wVar6 + -0x5c) == '\0';
  uVar13 = *(int *)((long)&gw[1].prev + 4) - 1;
LAB_0010c963:
  bVar21 = uVar13 == 0;
  goto LAB_0010c778;
}

Assistant:

int curses_display_menu_core(struct nh_menuitem *items, int icount,
			     const char *title, int how, int *results,
			     int x1, int y1, int x2, int y2,
			     nh_bool (*changefn)(struct win_menu*, int),
			     nh_bool start_at_bottom)
{
    struct gamewin *gw;
    struct win_menu *mdat;
    int i, key, idx, rv, startx, starty, prevcurs, prev_offset;
    nh_bool done, cancelled;
    char sbuf[BUFSZ];
    
    prevcurs = curs_set(0);
    
    gw = alloc_gamewin(sizeof(struct win_menu));
    gw->draw = draw_menu;
    gw->resize = resize_menu;
    mdat = (struct win_menu*)gw->extra;
    mdat->items = items;
    mdat->icount = icount;
    mdat->title = title;
    mdat->how = how;
    mdat->selected = calloc(icount, sizeof(nh_bool));
    mdat->x1 = x1; mdat->y1 = y1; mdat->x2 = x2; mdat->y2 = y2;
    
    if (x1 < 0) x1 = 0;
    if (y1 < 0) y1 = 0;
    if (x2 < 0) x2 = COLS;
    if (y2 < 0) y2 = LINES;
    
    assign_menu_accelerators(mdat);
    layout_menu(gw);

    if (start_at_bottom)
	mdat->offset = max(mdat->icount - mdat->innerheight, 0);

    starty = (y2 - y1 - mdat->height) / 2 + y1;
    startx = (x2 - x1 - mdat->width) / 2 + x1;
    
    gw->win = newwin(mdat->height, mdat->width, starty, startx);
    keypad(gw->win, TRUE);
    nh_box_wborder(gw->win, FRAME_ATTRS);
    mdat->content = derwin(gw->win, mdat->innerheight, mdat->innerwidth,
			   mdat->frameheight-1, 2);
    leaveok(gw->win, TRUE);
    leaveok(mdat->content, TRUE);
    done = FALSE;
    cancelled = FALSE;
    while (!done && !cancelled) {
	draw_menu(gw);
	
	key = nh_wgetch(gw->win);
	
	switch (key) {
	    /* one line up */
	    case KEY_UP:
		if (mdat->offset > 0)
		    mdat->offset--;
		break;
		
	    /* one line down */
	    case KEY_DOWN:
		if (mdat->offset < mdat->icount - mdat->innerheight)
		    mdat->offset++;
		break;
	    
	    /* page up */
	    case KEY_PPAGE:
	    case '<':
		mdat->offset -= mdat->innerheight;
		if (mdat->offset < 0)
		    mdat->offset = 0;
		break;
	    
	    /* page down */
	    case KEY_NPAGE:
	    case '>':
	    case ' ':
		prev_offset = mdat->offset;
		mdat->offset += mdat->innerheight;
		if (mdat->offset > mdat->icount - mdat->innerheight)
		    mdat->offset = mdat->icount - mdat->innerheight;
		if (key == ' ' && mdat->offset == prev_offset)
		    done = TRUE;
		break;
		
	    /* go to the top */
	    case KEY_HOME:
	    case '^':
		mdat->offset = 0;
		break;
		
	    /* go to the end */
	    case KEY_END:
	    case '|':
		mdat->offset = max(mdat->icount - mdat->innerheight, 0);
		break;
		
	    /* cancel */
	    case KEY_ESC:
		cancelled = TRUE;
		break;
		
	    /* confirm */
	    case KEY_ENTER:
	    case '\r':
		done = TRUE;
		break;
		
	    /* select all */
	    case '.':
		if (mdat->how == PICK_ANY)
		    for (i = 0; i < icount; i++)
			if (mdat->items[i].role == MI_NORMAL)
			    mdat->selected[i] = TRUE;
		break;
		
	    /* select none */
	    case '-':
		for (i = 0; i < icount; i++)
		    mdat->selected[i] = FALSE;
		break;
		
	    /* search for a menu item */
	    case ':':
		curses_getline("Search:", sbuf);
		for (i = 0; i < icount; i++)
		    if (strstr(mdat->items[i].caption, sbuf))
			break;
		if (i < icount) {
		    int end = max(mdat->icount - mdat->innerheight, 0);
		    mdat->offset = min(i, end);
		}
		break;
		
	    /* try to find an item for this key and, if one is found, select it */
	    default:
		idx = find_accel(key, mdat);
		
		if (idx != -1 && /* valid accelerator */
		    (!changefn || changefn(mdat, idx))) {
		    mdat->selected[idx] = !mdat->selected[idx];
		    
		    if (mdat->how == PICK_ONE)
			done = TRUE;
		}
		break;
	}
    }
    
    delwin(mdat->content);
    delwin(gw->win);
    
    if (cancelled)
	rv = -1;
    else {
	rv = 0;
	for (i = 0; i < icount; i++) {
	    if (mdat->selected[i]) {
		if (results)
		    results[rv] = items[i].id;
		rv++;
	    }
	}
    }
    
    free(mdat->selected);
    delete_gamewin(gw);    
    redraw_game_windows();
    curs_set(prevcurs);
	
    return rv;
}